

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_install_info.cpp
# Opt level: O2

void __thiscall
duckdb::ExtensionRepository::ExtensionRepository
          (ExtensionRepository *this,string *name_p,string *path_p)

{
  ::std::__cxx11::string::string((string *)this,(string *)name_p);
  ::std::__cxx11::string::string((string *)&this->path,(string *)path_p);
  return;
}

Assistant:

ExtensionRepository::ExtensionRepository(const string &name_p, const string &path_p) : name(name_p), path(path_p) {
}